

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

void prvTidyRepairDuplicateAttributes(TidyDocImpl *doc,Node *node,Bool isXml)

{
  TidyAttrId TVar1;
  TidyAttrId TVar2;
  TidyAllocator *pTVar3;
  _func_void_ptr_TidyAllocator_ptr_void_ptr_size_t *p_Var4;
  long lVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  tmbstr ptVar9;
  AttVal *classattr;
  AttVal *av;
  ctmbstr s2;
  char *str;
  bool bVar10;
  AttVal *pAVar11;
  bool bVar12;
  bool bVar13;
  
  pAVar11 = node->attributes;
joined_r0x0013cf45:
  classattr = pAVar11;
  if (classattr == (AttVal *)0x0) {
    return;
  }
  if (classattr->asp == (Node *)0x0) goto LAB_0013cf5d;
  goto LAB_0013cf58;
LAB_0013cf5d:
  av = classattr->next;
  pAVar11 = av;
  if (classattr->php == (Node *)0x0) {
    if (av == (AttVal *)0x0) {
LAB_0013cf58:
      pAVar11 = classattr->next;
    }
    else {
      bVar10 = true;
      do {
        while ((av->asp != (Node *)0x0 || (av->php != (Node *)0x0))) {
LAB_0013cf8d:
          av = av->next;
LAB_0013cf91:
          if (av == (AttVal *)0x0) {
            pAVar11 = classattr;
            if (bVar10) goto LAB_0013cf58;
            goto joined_r0x0013cf45;
          }
        }
        if ((classattr == (AttVal *)0x0) || (classattr->dict == (Attribute *)0x0)) {
          bVar12 = false;
        }
        else {
          bVar12 = classattr->dict->id != TidyAttr_UNKNOWN;
        }
        if (av->dict == (Attribute *)0x0) {
          bVar13 = false;
LAB_0013cfea:
          if ((((bool)(bVar12 | bVar13)) || (classattr->attribute == (ctmbstr)0x0)) ||
             ((av->attribute == (ctmbstr)0x0 ||
              (iVar6 = prvTidytmbstrcmp(classattr->attribute,av->attribute), iVar6 != 0))))
          goto LAB_0013cf8d;
        }
        else {
          TVar1 = av->dict->id;
          bVar13 = TVar1 != TidyAttr_UNKNOWN;
          if (!(bool)(bVar12 & bVar13)) goto LAB_0013cfea;
          if ((((classattr == (AttVal *)0x0) || (classattr->dict == (Attribute *)0x0)) ||
              (TVar2 = classattr->dict->id, TVar2 == TidyAttr_UNKNOWN)) || (TVar2 != TVar1))
          goto LAB_0013cf8d;
        }
        if ((isXml == no) && (classattr->dict != (Attribute *)0x0)) {
          TVar1 = classattr->dict->id;
          if (TVar1 == TidyAttr_STYLE) {
            if (((*(int *)((doc->config).value + 0x29) == 0) || (classattr->value == (ctmbstr)0x0))
               || (str = av->value, str == (ctmbstr)0x0)) goto LAB_0013d012;
            uVar7 = prvTidytmbstrlen(classattr->value);
            ptVar9 = classattr->value;
            lVar5 = (long)uVar7;
            if (uVar7 == 0) {
LAB_0013d172:
              pTVar3 = doc->allocator;
              p_Var4 = pTVar3->vtbl->realloc;
              uVar8 = prvTidytmbstrlen(str);
              ptVar9 = (tmbstr)(*p_Var4)(pTVar3,ptVar9,(long)uVar8 + lVar5 + 3);
              classattr->value = ptVar9;
              if (uVar7 != 0) {
                s2 = "; ";
LAB_0013d1bb:
                prvTidytmbstrcat(ptVar9,s2);
                ptVar9 = classattr->value;
              }
            }
            else {
              if (ptVar9[uVar7 - 1] != '}') {
                if (ptVar9[uVar7 - 1] != ';') goto LAB_0013d172;
                pTVar3 = doc->allocator;
                p_Var4 = pTVar3->vtbl->realloc;
                uVar7 = prvTidytmbstrlen(str);
                ptVar9 = (tmbstr)(*p_Var4)(pTVar3,ptVar9,(long)uVar7 + lVar5 + 2);
                classattr->value = ptVar9;
                s2 = " ";
                goto LAB_0013d1bb;
              }
              pTVar3 = doc->allocator;
              p_Var4 = pTVar3->vtbl->realloc;
              uVar7 = prvTidytmbstrlen(str);
              ptVar9 = (tmbstr)(*p_Var4)(pTVar3,ptVar9,(long)uVar7 + lVar5 + 6);
              classattr->value = ptVar9;
              prvTidytmbstrcat(ptVar9," { ");
              prvTidytmbstrcat(classattr->value,str);
              ptVar9 = classattr->value;
              str = " }";
            }
            prvTidytmbstrcat(ptVar9,str);
          }
          else {
            if (((TVar1 != TidyAttr_CLASS) || (*(int *)((doc->config).value + 0x28) == 0)) ||
               ((classattr->value == (tmbstr)0x0 || (av->value == (ctmbstr)0x0))))
            goto LAB_0013d012;
            prvTidyAppendToClassAttr(doc,classattr,av->value);
          }
          pAVar11 = av->next;
          uVar7 = 0x24e;
LAB_0013d032:
          prvTidyReportAttrError(doc,node,av,uVar7);
          prvTidyRemoveAttribute(doc,node,av);
          av = pAVar11;
          goto LAB_0013cf91;
        }
LAB_0013d012:
        if ((doc->config).value[0x12].v != 1) {
          pAVar11 = av->next;
          uVar7 = 0x272;
          goto LAB_0013d032;
        }
        pAVar11 = classattr->next;
        prvTidyReportAttrError(doc,node,classattr,0x272);
        prvTidyRemoveAttribute(doc,node,classattr);
        av = av->next;
        bVar10 = false;
        classattr = pAVar11;
      } while (av != (AttVal *)0x0);
    }
  }
  goto joined_r0x0013cf45;
}

Assistant:

void TY_(RepairDuplicateAttributes)( TidyDocImpl* doc, Node *node, Bool isXml )
{
    AttVal *first;

    for (first = node->attributes; first != NULL;)
    {
        AttVal *second;
        Bool firstRedefined = no;

        if (!(first->asp == NULL && first->php == NULL))
        {
            first = first->next;
            continue;
        }

        for (second = first->next; second != NULL;)
        {
            AttVal *temp;

            if (!(second->asp == NULL && second->php == NULL
                  && AttrsHaveSameName(first, second)))
            {
                second = second->next;
                continue;
            }

            /* first and second attribute have same local name */
            /* now determine what to do with this duplicate... */

            if (!isXml
                && attrIsCLASS(first) && cfgBool(doc, TidyJoinClasses)
                && AttrHasValue(first) && AttrHasValue(second))
            {
                /* concatenate classes */

                TY_(AppendToClassAttr)(doc, first, second->value);

                temp = second->next;
                TY_(ReportAttrError)( doc, node, second, JOINING_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, second );
                second = temp;
            }
            else if (!isXml
                     && attrIsSTYLE(first) && cfgBool(doc, TidyJoinStyles)
                     && AttrHasValue(first) && AttrHasValue(second))
            {
                AppendToStyleAttr( doc, first, second->value );

                temp = second->next;
                TY_(ReportAttrError)( doc, node, second, JOINING_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, second );
                second = temp;
            }
            else if ( cfg(doc, TidyDuplicateAttrs) == TidyKeepLast )
            {
                temp = first->next;
                TY_(ReportAttrError)( doc, node, first, REPEATED_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, first );
                firstRedefined = yes;
                first = temp;
                second = second->next;
            }
            else /* TidyDuplicateAttrs == TidyKeepFirst */
            {
                temp = second->next;
                TY_(ReportAttrError)( doc, node, second, REPEATED_ATTRIBUTE);
                TY_(RemoveAttribute)( doc, node, second );
                second = temp;
            }
        }
        if (!firstRedefined)
            first = first->next;
    }
}